

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscSystemFuncs.cpp
# Opt level: O0

ConstantValue * __thiscall
slang::ast::builtins::SFormatFunction::eval
          (SFormatFunction *this,EvalContext *context,Args *args,SourceRange param_4,
          SystemCallInfo *callInfo)

{
  bool bVar1;
  reference ppEVar2;
  Scope *this_00;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_RCX;
  uint uVar3;
  ConstantValue *in_RDI;
  bool in_stack_00000017;
  EvalContext *in_stack_00000018;
  Scope *in_stack_00000020;
  SourceLocation in_stack_00000028;
  undefined1 in_stack_00000030 [16];
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_stack_00000050;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> result;
  ConstantValue formatStr;
  nullptr_t in_stack_fffffffffffffec8;
  string *str;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  Expression *in_stack_fffffffffffffed8;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> local_e0;
  undefined1 local_d0 [24];
  ConstantValue *in_stack_ffffffffffffff48;
  
  std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RCX,0);
  Expression::eval(in_stack_fffffffffffffed8,
                   (EvalContext *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
  slang::ConstantValue::convertToStr(in_stack_ffffffffffffff48);
  slang::ConstantValue::~ConstantValue((ConstantValue *)0x136417b);
  bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0x1364188);
  if (bVar1) {
    slang::ConstantValue::str_abi_cxx11_((ConstantValue *)0x1364204);
    local_d0._8_16_ =
         (undefined1  [16])
         std::__cxx11::string::operator_cast_to_basic_string_view
                   ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
    ppEVar2 = std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
                        (in_RCX,0);
    local_d0._0_8_ = SourceRange::start(&(*ppEVar2)->sourceRange);
    this_00 = not_null<const_slang::ast::Scope_*>::operator*
                        ((not_null<const_slang::ast::Scope_*> *)0x136425e);
    local_e0 = std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::subspan
                         ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                          this_00,(size_type)in_stack_fffffffffffffed8,
                          CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
    ppEVar2 = std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
                        (in_RCX,0);
    uVar3 = (uint)((*ppEVar2)->kind == StringLiteral);
    str = (string *)&local_e0;
    FmtHelpers::formatArgs_abi_cxx11_
              ((string_view)in_stack_00000030,in_stack_00000028,in_stack_00000020,in_stack_00000018,
               in_stack_00000050,in_stack_00000017);
    bVar1 = std::optional::operator_cast_to_bool
                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)0x13642f5);
    if (bVar1) {
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x1364346);
      slang::ConstantValue::ConstantValue
                ((ConstantValue *)CONCAT44(in_stack_fffffffffffffed4,uVar3),str);
    }
    else {
      slang::ConstantValue::ConstantValue
                ((ConstantValue *)CONCAT44(in_stack_fffffffffffffed4,uVar3),str);
    }
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x136436d);
  }
  else {
    slang::ConstantValue::ConstantValue
              ((ConstantValue *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               in_stack_fffffffffffffec8);
  }
  slang::ConstantValue::~ConstantValue((ConstantValue *)0x136437a);
  return in_RDI;
}

Assistant:

ConstantValue eval(EvalContext& context, const Args& args, SourceRange,
                       const CallExpression::SystemCallInfo& callInfo) const final {
        ConstantValue formatStr = args[0]->eval(context).convertToStr();
        if (!formatStr)
            return nullptr;

        auto result = FmtHelpers::formatArgs(formatStr.str(), args[0]->sourceRange.start(),
                                             *callInfo.scope, context, args.subspan(1),
                                             args[0]->kind == ExpressionKind::StringLiteral);
        if (!result)
            return nullptr;

        return *result;
    }